

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O1

QByteArray * escapeDependencyPath<QByteArray>(QByteArray *__return_storage_ptr__,QByteArray *path)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  char ch;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar6 = (uint)(path->d).size;
  lVar4 = (long)(int)uVar6;
  pDVar2 = (__return_storage_ptr__->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar2->super_QArrayData).alloc) - (long)(__return_storage_ptr__->d).ptr) < lVar4)) {
    lVar3 = (__return_storage_ptr__->d).size;
    if (lVar4 < lVar3) {
      lVar4 = lVar3;
    }
    QByteArray::reallocData(__return_storage_ptr__,lVar4,KeepSize);
  }
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (0 < (int)uVar6) {
    lVar4 = 1;
    uVar5 = 0;
    do {
      ch = (path->d).ptr[uVar5];
      if (ch == ' ') {
        QByteArray::append(__return_storage_ptr__,'\\');
        lVar3 = lVar4;
        if (1 < uVar5) {
          do {
            if ((path->d).ptr[(int)lVar3 - 2] != '\\') break;
            QByteArray::append(__return_storage_ptr__,'\\');
            lVar3 = lVar3 + -1;
          } while (2 < lVar3);
        }
      }
      else {
        if (ch != '$') {
          if (ch != '#') goto LAB_0011be6a;
          ch = '\\';
        }
        QByteArray::append(__return_storage_ptr__,ch);
      }
LAB_0011be6a:
      QByteArray::append(__return_storage_ptr__,(path->d).ptr[uVar5]);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (uVar5 != (uVar6 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}